

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sockfd.c
# Opt level: O1

void sfd_tran_ep_match(sfd_tran_ep *ep)

{
  nni_aio *aio;
  void *item;
  
  aio = ep->useraio;
  if (aio != (nni_aio *)0x0) {
    item = nni_list_first(&ep->waitpipes);
    if (item != (void *)0x0) {
      nni_list_remove(&ep->waitpipes,item);
      ep->useraio = (nni_aio *)0x0;
      *(size_t *)((long)item + 0x18) = ep->rcvmax;
      nni_aio_set_output(aio,0,*(void **)((long)item + 8));
      nni_aio_finish(aio,NNG_OK,0);
      return;
    }
  }
  return;
}

Assistant:

static void
sfd_tran_ep_match(sfd_tran_ep *ep)
{
	nni_aio       *aio;
	sfd_tran_pipe *p;

	if (((aio = ep->useraio) == NULL) ||
	    ((p = nni_list_first(&ep->waitpipes)) == NULL)) {
		return;
	}
	nni_list_remove(&ep->waitpipes, p);
	ep->useraio = NULL;
	p->rcvmax   = ep->rcvmax;
	nni_aio_set_output(aio, 0, p->npipe);
	nni_aio_finish(aio, 0, 0);
}